

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-backend.cpp
# Opt level: O2

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,int n_tokens)

{
  ggml_tensor *pgVar1;
  ggml_cgraph *pgVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined4 in_register_00000034;
  long lVar11;
  gpt2_model *pgVar12;
  int iVar13;
  ulong uVar14;
  float fVar15;
  allocator_type local_109;
  gpt2_model *local_108;
  undefined8 local_100;
  float local_f4;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  float local_c4;
  ggml_cgraph *local_c0;
  undefined8 local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  ulong local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  local_b8 = CONCAT44(in_register_00000034,n_past);
  uVar9 = (ulong)(model->hparams).n_embd;
  local_e0 = (ulong)(uint)(model->hparams).n_layer;
  local_f0 = (long)(model->hparams).n_ctx;
  local_d8 = (long)(model->hparams).n_head;
  local_108 = model;
  if (gpt2_graph(gpt2_model_const&,int,int)::buf_size == '\0') {
    iVar3 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,int)::buf_size);
    if (iVar3 != 0) {
      lVar11 = ggml_tensor_overhead();
      lVar10 = ggml_graph_overhead_custom(0x1000,0);
      gpt2_graph::buf_size = lVar10 + lVar11 * 0x1000;
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,int)::buf_size);
    }
  }
  local_e8 = uVar9;
  if (gpt2_graph(gpt2_model_const&,int,int)::buf == '\0') {
    iVar3 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,int)::buf);
    if (iVar3 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&gpt2_graph::buf,gpt2_graph::buf_size,&local_109);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &gpt2_graph::buf,&__dso_handle);
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,int)::buf);
    }
  }
  local_48 = gpt2_graph::buf_size;
  puStack_40 = gpt2_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar4 = ggml_init();
  uVar9 = 0;
  local_c0 = (ggml_cgraph *)ggml_new_graph_custom(uVar4,0x1000,0);
  lVar11 = (long)n_tokens;
  uVar5 = ggml_new_tensor_1d(uVar4,0x1a,lVar11);
  ggml_set_name(uVar5,"embd");
  ggml_set_input(uVar5);
  uVar6 = ggml_new_tensor_1d(uVar4,0x1a,lVar11);
  ggml_set_name(uVar6,"position");
  ggml_set_input(uVar6);
  pgVar12 = local_108;
  uVar5 = ggml_get_rows(uVar4,local_108->wte,uVar5);
  uVar6 = ggml_get_rows(uVar4,pgVar12->wpe,uVar6);
  uVar5 = ggml_add(uVar4,uVar5,uVar6);
  local_78 = local_e8 * 4;
  local_80 = local_e8 * 8;
  iVar13 = (int)local_e8;
  local_90 = (long)(iVar13 * n_tokens);
  iVar3 = n_tokens + (int)local_b8;
  local_98 = (long)(iVar13 * iVar3);
  local_a0 = (long)iVar3;
  local_f4 = (float)iVar13 / (float)(int)local_d8;
  local_70 = local_e0 & 0xffffffff;
  if ((int)local_e0 < 1) {
    local_70 = uVar9;
  }
  local_70 = local_70 * 0x60;
  local_a8 = (long)(int)local_b8 * local_e8;
  local_88 = local_f0 * local_e8;
  local_c4 = SQRT(local_f4);
  lVar10 = 0;
  local_b0 = 0;
  uVar14 = local_e8;
  local_d0 = lVar11;
  while( true ) {
    uVar6 = ggml_norm((pgVar12->hparams).eps,uVar4,uVar5);
    if (local_70 == uVar9) break;
    local_58 = uVar5;
    uVar5 = ggml_mul(uVar4,uVar6,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_1_g + uVar9));
    uVar5 = ggml_add(uVar4,uVar5,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_1_b + uVar9));
    uVar5 = ggml_mul_mat(uVar4,*(undefined8 *)
                                ((long)&((pgVar12->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_w +
                                uVar9),uVar5);
    local_e0 = uVar9;
    lVar7 = ggml_add(uVar4,uVar5,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_attn_attn_b + uVar9));
    lVar11 = local_d0;
    local_100 = ggml_view_2d(uVar4,lVar7,uVar14,local_d0,*(undefined8 *)(lVar7 + 0x38),0);
    local_60 = ggml_view_2d(uVar4,lVar7,uVar14,lVar11,*(undefined8 *)(lVar7 + 0x38),local_78);
    uVar5 = ggml_view_2d(uVar4,lVar7,uVar14,lVar11,*(undefined8 *)(lVar7 + 0x38),local_80);
    local_50 = lVar10;
    if (0 < (int)lVar11) {
      pgVar1 = local_108->memory_k;
      local_68 = uVar5;
      lVar8 = ggml_element_size(pgVar1);
      lVar7 = local_90;
      lVar11 = local_a8;
      lVar10 = local_b0 * local_f0;
      uVar5 = ggml_view_1d(uVar4,pgVar1,local_90,lVar8 * local_a8);
      pgVar1 = local_108->memory_v;
      lVar8 = ggml_element_size(pgVar1);
      uVar14 = local_e8;
      uVar6 = ggml_view_1d(uVar4,pgVar1,lVar7,lVar8 * lVar11);
      pgVar12 = local_108;
      uVar5 = ggml_cpy(uVar4,local_60,uVar5);
      pgVar2 = local_c0;
      ggml_build_forward_expand(local_c0,uVar5);
      uVar5 = ggml_cpy(uVar4,local_68,uVar6);
      ggml_build_forward_expand(pgVar2,uVar5);
    }
    lVar11 = local_d8;
    lVar8 = (long)(int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
                       (long)(int)local_d8);
    uVar5 = ggml_cont_3d(uVar4,local_100,lVar8,local_d8,local_d0);
    local_100 = ggml_permute(uVar4,uVar5,0,2,1,3);
    pgVar1 = pgVar12->memory_k;
    lVar7 = ggml_element_size(pgVar1);
    uVar5 = ggml_view_1d(uVar4,pgVar1,local_98,lVar7 * lVar10 * uVar14);
    uVar5 = ggml_reshape_3d(uVar4,uVar5,lVar8,lVar11,local_a0);
    uVar5 = ggml_permute(uVar4,uVar5,0,2,1,3);
    uVar5 = ggml_mul_mat(uVar4,uVar5,local_100);
    fVar15 = local_c4;
    if (local_f4 < 0.0) {
      fVar15 = sqrtf(local_f4);
    }
    uVar5 = ggml_scale(1.0 / fVar15,uVar4,uVar5);
    uVar5 = ggml_diag_mask_inf(uVar4,uVar5,local_b8);
    local_100 = ggml_soft_max(uVar4,uVar5);
    pgVar1 = local_108->memory_v;
    lVar11 = ggml_element_size(pgVar1);
    uVar5 = ggml_view_1d(uVar4,pgVar1,local_98,lVar10 * uVar14 * lVar11);
    lVar10 = local_a0;
    lVar11 = local_d8;
    uVar5 = ggml_reshape_3d(uVar4,uVar5,lVar8,local_d8,local_a0);
    uVar5 = ggml_permute(uVar4,uVar5,1,2,0,3);
    pgVar12 = local_108;
    uVar5 = ggml_cont_3d(uVar4,uVar5,lVar10,lVar8,lVar11);
    uVar5 = ggml_mul_mat(uVar4,uVar5,local_100);
    uVar5 = ggml_permute(uVar4,uVar5,0,2,1);
    uVar14 = local_e8;
    uVar5 = ggml_cont_2d(uVar4,uVar5,local_e8,local_d0);
    uVar9 = local_e0;
    uVar5 = ggml_mul_mat(uVar4,*(undefined8 *)
                                ((long)&((pgVar12->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_w +
                                local_e0),uVar5);
    uVar5 = ggml_add(uVar4,uVar5,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_attn_proj_b + uVar9));
    uVar5 = ggml_add(uVar4,uVar5,local_58);
    uVar6 = ggml_norm((pgVar12->hparams).eps,uVar4,uVar5);
    uVar6 = ggml_mul(uVar4,uVar6,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_2_g + uVar9));
    uVar6 = ggml_add(uVar4,uVar6,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_2_b + uVar9));
    uVar6 = ggml_mul_mat(uVar4,*(undefined8 *)
                                ((long)&((pgVar12->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                uVar9),uVar6);
    uVar6 = ggml_add(uVar4,uVar6,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_mlp_fc_b + uVar9));
    uVar6 = ggml_gelu(uVar4,uVar6);
    uVar6 = ggml_mul_mat(uVar4,*(undefined8 *)
                                ((long)&((pgVar12->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w +
                                uVar9),uVar6);
    uVar6 = ggml_add(uVar4,uVar6,
                     *(undefined8 *)
                      ((long)&((pgVar12->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_mlp_proj_b + uVar9));
    uVar5 = ggml_add(uVar4,uVar6,uVar5);
    local_b0 = local_b0 + 1;
    lVar10 = local_50 + local_f0;
    uVar9 = uVar9 + 0x60;
    local_a8 = local_a8 + local_88;
  }
  uVar5 = ggml_mul(uVar4,uVar6,pgVar12->ln_f_g);
  uVar5 = ggml_add(uVar4,uVar5,pgVar12->ln_f_b);
  uVar5 = ggml_mul_mat(uVar4,pgVar12->lm_head,uVar5);
  ggml_set_name(uVar5,"logits");
  ggml_set_output(uVar5);
  pgVar2 = local_c0;
  ggml_build_forward_expand(local_c0,uVar5);
  ggml_free(uVar4);
  return pgVar2;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const int n_tokens) {
    const int N = n_tokens;

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, N);
    // at this point, the tensor data is not allocated yet and cannot be set
    // we will find the tensor after the graph is allocated by its name, and set the data then
    ggml_set_name(embd, "embd");
    // setting a tensor as an input will ensure that it is allocated at the beginning of the graph
    // this is important to ensure that the input tensors are not overwritten before they are used
    ggml_set_input(embd);

    struct ggml_tensor * position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, N);
    ggml_set_name(position, "position");
    ggml_set_input(position);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled =
                ggml_scale(ctx,
                        KQ,
                        1.0f/sqrtf(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_set_name(inpL, "logits");
    // setting a tensor as the output will ensure that it is not overwritten by subsequent operations
    ggml_set_output(inpL);

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}